

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightdata.cpp
# Opt level: O0

void gl_SetShaderLight(float level,float olight)

{
  float f;
  float local_20;
  float lightfactor;
  float lightdist;
  float FACTOR;
  float THRESHOLD;
  float MAXDIST;
  float olight_local;
  float level_local;
  
  if (level <= 0.0) {
    FRenderState::SetLightParms(&gl_RenderState,1.0,0.0);
  }
  else {
    if (96.0 <= olight) {
      local_20 = 256.0;
      THRESHOLD = olight;
    }
    else {
      local_20 = ((olight * 256.0) / 96.0) / 2.0 + 128.0;
      THRESHOLD = 96.0;
    }
    f = (THRESHOLD / level - 1.0) * 0.75 + 1.0;
    if ((f == 1.0) && (!NAN(f))) {
      local_20 = 0.0;
    }
    FRenderState::SetLightParms(&gl_RenderState,f,local_20);
  }
  return;
}

Assistant:

void gl_SetShaderLight(float level, float olight)
{
	const float MAXDIST = 256.f;
	const float THRESHOLD = 96.f;
	const float FACTOR = 0.75f;

	if (level > 0)
	{
		float lightdist, lightfactor;
			
		if (olight < THRESHOLD)
		{
			lightdist = (MAXDIST/2) + (olight * MAXDIST / THRESHOLD / 2);
			olight = THRESHOLD;
		}
		else lightdist = MAXDIST;

		lightfactor = 1.f + ((olight/level) - 1.f) * FACTOR;
		if (lightfactor == 1.f) lightdist = 0.f;	// save some code in the shader
		gl_RenderState.SetLightParms(lightfactor, lightdist);
	}
	else
	{
		gl_RenderState.SetLightParms(1.f, 0.f);
	}
}